

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O3

void hookf(lua_State *L,lua_Debug *ar)

{
  int iVar1;
  
  lua_rawgetp(L,-0xf4628,&HOOKKEY);
  lua_pushthread(L);
  iVar1 = lua_rawget(L,-2);
  if (iVar1 == 6) {
    lua_pushstring(L,hookf_hooknames_rel + *(int *)(hookf_hooknames_rel + (long)ar->event * 4));
    if ((long)ar->currentline < 0) {
      lua_pushnil(L);
    }
    else {
      lua_pushinteger(L,(long)ar->currentline);
    }
    lua_callk(L,2,0,0,(lua_KFunction)0x0);
    return;
  }
  return;
}

Assistant:

static void hookf (lua_State *L, lua_Debug *ar) {
  static const char *const hooknames[] =
    {"call", "return", "line", "count", "tail call"};
  lua_rawgetp(L, LUA_REGISTRYINDEX, &HOOKKEY);
  lua_pushthread(L);
  if (lua_rawget(L, -2) == LUA_TFUNCTION) {  /* is there a hook function? */
    lua_pushstring(L, hooknames[(int)ar->event]);  /* push event name */
    if (ar->currentline >= 0)
      lua_pushinteger(L, ar->currentline);  /* push current line */
    else lua_pushnil(L);
    lua_assert(lua_getinfo(L, "lS", ar));
    lua_call(L, 2, 0);  /* call hook function */
  }
}